

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  byte bVar1;
  undefined1 _missingAssertions;
  bool bVar2;
  IStreamingReporter *pIVar3;
  TestCaseTracker *stream;
  SectionInfo *_sectionInfo;
  long in_RDI;
  SectionStats testCaseSectionStats;
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Timer timer;
  Guard guard;
  double duration;
  Counts prevAssertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionInfo *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff797;
  RunContext *this_00;
  undefined7 in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  Flags _resultDisposition;
  SectionStats *this_01;
  SourceLineInfo *in_stack_fffffffffffff7b8;
  SectionInfo *in_stack_fffffffffffff7c0;
  RunContext *this_02;
  string *_macroName;
  AssertionInfo *this_03;
  undefined1 local_818 [159];
  undefined1 local_779;
  unsigned_long uStack_770;
  unsigned_long local_768 [186];
  byte local_191;
  Timer local_190 [2];
  undefined1 local_179 [40];
  undefined1 local_151 [33];
  SectionStats local_130;
  undefined1 local_88 [104];
  TestCaseInfo *local_20;
  
  local_20 = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  SectionInfo::SectionInfo
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
             in_stack_fffffffffffff7a8);
  _resultDisposition = (Flags)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x1a8));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,local_88);
  local_130.durationInSeconds = *(double *)(in_RDI + 0x188);
  local_130.assertions.failed = *(size_t *)(in_RDI + 0x178);
  local_130.assertions.failedButOk = *(size_t *)(in_RDI + 0x180);
  local_130.assertions.passed = 0;
  this_03 = (AssertionInfo *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_151 + 1),"TEST_CASE",(allocator *)this_03);
  this_02 = (RunContext *)&local_20->lineInfo;
  _macroName = (string *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_179 + 1),"",(allocator *)_macroName);
  AssertionInfo::AssertionInfo
            (this_03,_macroName,(SourceLineInfo *)this_02,&in_stack_fffffffffffff7b8->file,
             _resultDisposition);
  this_01 = &local_130;
  AssertionInfo::operator=
            ((AssertionInfo *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788);
  AssertionInfo::~AssertionInfo
            ((AssertionInfo *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  stream = Option<Catch::SectionTracking::TestCaseTracker>::operator*
                     ((Option<Catch::SectionTracking::TestCaseTracker> *)(in_RDI + 0x40));
  SectionTracking::TestCaseTracker::Guard::Guard
            ((Guard *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
             (TestCaseTracker *)in_stack_fffffffffffff788);
  Timer::Timer(local_190);
  Timer::start((Timer *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  _sectionInfo = (SectionInfo *)
                 Ptr<Catch::IStreamingReporter>::operator->
                           ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x1a8));
  bVar1 = (**(code **)((long)*(NonCopyable *)&_sectionInfo->name + 0x20))();
  local_191 = bVar1;
  if ((bVar1 & 1) == 0) {
    invokeActiveTestCase((RunContext *)CONCAT17(bVar1,in_stack_fffffffffffff7a0));
  }
  else {
    cout();
    StreamRedirect::StreamRedirect((StreamRedirect *)this_02,(ostream *)stream,(string *)this_01);
    cerr();
    StreamRedirect::StreamRedirect((StreamRedirect *)this_02,(ostream *)stream,(string *)this_01);
    invokeActiveTestCase((RunContext *)CONCAT17(bVar1,in_stack_fffffffffffff7a0));
    StreamRedirect::~StreamRedirect((StreamRedirect *)this_02);
    StreamRedirect::~StreamRedirect((StreamRedirect *)this_02);
  }
  this_00 = (RunContext *)Timer::getElapsedSeconds((Timer *)0x26120c);
  local_130.assertions.passed = (size_t)this_00;
  SectionTracking::TestCaseTracker::Guard::~Guard((Guard *)0x261230);
  handleUnfinishedSections(this_02);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x26128e);
  Counts::operator-((Counts *)CONCAT17(bVar1,in_stack_fffffffffffff7a0),(Counts *)this_00);
  _missingAssertions =
       testForMissingAssertions
                 (this_00,(Counts *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  local_779 = _missingAssertions;
  bVar2 = TestCaseInfo::okToFail(local_20);
  if (bVar2) {
    std::swap<unsigned_long>(local_768,&uStack_770);
    *(unsigned_long *)(in_RDI + 0x180) = *(long *)(in_RDI + 0x180) - local_768[0];
    *(unsigned_long *)(in_RDI + 0x188) = local_768[0] + *(long *)(in_RDI + 0x188);
  }
  SectionStats::SectionStats
            (this_01,_sectionInfo,(Counts *)CONCAT17(bVar1,in_stack_fffffffffffff7a0),
             (double)this_00,(bool)_missingAssertions);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x1a8));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,local_818);
  SectionStats::~SectionStats((SectionStats *)0x261435);
  SectionInfo::~SectionInfo((SectionInfo *)CONCAT17(_missingAssertions,in_stack_fffffffffffff790));
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }